

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O2

ll_elem * ll_succ(ll_head *q_head,ll_elem *n)

{
  ll_elem *plVar1;
  ll_head *q_head_00;
  size_t count;
  
  plVar1 = succ(q_head,n);
  q_head_00 = (ll_head *)((ulong)plVar1 & 0xfffffffffffffffc);
  if (q_head_00 == q_head) {
    deref_release(q_head_00,(ll_elem *)0x1,count);
    q_head_00 = (ll_head *)0x0;
  }
  return &q_head_00->q;
}

Assistant:

struct ll_elem*
ll_succ(struct ll_head *q_head, struct ll_elem *n)
{
	struct ll_elem	*s;

	s = succ(q_head, n);

	/* Clean away the flag bits. */
	s = ptr_clear(s);
	if (s == &q_head->q) {
		/* Don't return q: it is not an element of the list. */
		deref_release(q_head, s, 1);
		s = NULL;
	}
	return s;
}